

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_frontend_test.cpp
# Opt level: O0

uint __thiscall test_app::cache_size(test_app *this)

{
  uint *puVar1;
  ulong uVar2;
  ostream *poVar3;
  runtime_error *this_00;
  ostringstream oss;
  uint triggers;
  uint keys;
  string local_1b8 [48];
  ostringstream local_188 [380];
  uint local_c [3];
  
  puVar1 = (uint *)cppcms::application::cache();
  uVar2 = cppcms::cache_interface::stats(puVar1,local_c);
  if ((uVar2 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    poVar3 = std::operator<<((ostream *)local_188,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x144);
    std::operator<<(poVar3," cache().stats(keys,triggers)");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this_00,local_1b8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_c[0];
}

Assistant:

unsigned cache_size()
	{
		unsigned keys,triggers;
		TEST(cache().stats(keys,triggers));
		return keys;
	}